

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  SUNMatrix_ID SVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_48;
  
  SVar1 = SUNMatGetID(A);
  if (SVar1 != SUNMATRIX_BAND) {
    return;
  }
  fputc(10,(FILE *)outfile);
  plVar2 = (long *)A->content;
  if (0 < *plVar2) {
    local_48 = 0;
    lVar3 = 0;
    do {
      lVar4 = lVar3 - plVar2[4];
      lVar6 = plVar2[1] + -1;
      if (plVar2[3] + lVar3 < plVar2[1]) {
        lVar6 = plVar2[3] + lVar3;
      }
      lVar7 = 0;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          fprintf((FILE *)outfile,"%12s  ","");
          lVar5 = lVar5 + 1;
          lVar7 = lVar4;
        } while (lVar5 < lVar4);
      }
      if (lVar7 <= lVar6) {
        if (lVar4 < 1) {
          lVar4 = 0;
        }
        lVar7 = lVar4 + -1;
        lVar4 = local_48 + lVar4 * -8;
        do {
          fprintf((FILE *)outfile,"%12g  ",
                  *(undefined8 *)
                   (lVar4 + *(long *)((long)A->content + 0x28) * 8 +
                            *(long *)(*(long *)((long)A->content + 0x40) + 8 + lVar7 * 8)));
          lVar7 = lVar7 + 1;
          lVar4 = lVar4 + -8;
        } while (lVar7 < lVar6);
      }
      fputc(10,(FILE *)outfile);
      lVar3 = lVar3 + 1;
      plVar2 = (long *)A->content;
      local_48 = local_48 + 8;
    } while (lVar3 < *plVar2);
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  sunindextype i, j, start, finish;

  /* should not be called unless A is a band matrix; 
     otherwise return immediately */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return;

  /* perform operation */
  fprintf(outfile,"\n");
  for (i=0; i<SM_ROWS_B(A); i++) {
    start = SUNMAX(0, i-SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A)-1, i+SM_UBAND_B(A));
    for (j=0; j<start; j++)
      fprintf(outfile,"%12s  ","");
    for (j=start; j<=finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile,"%12Lg  ", SM_ELEMENT_B(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#else
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#endif
    }
    fprintf(outfile,"\n");
  }
  fprintf(outfile,"\n");
  return;
}